

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

void __thiscall
ShowRulesIRCCommand::trigger
          (ShowRulesIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  undefined8 uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  size_t local_40;
  char *local_38;
  
  local_38 = channel._M_str;
  local_40 = channel._M_len;
  lVar2 = Jupiter::IRC::Client::getChannel
                    (source,local_40,local_38,local_38,nick._M_len,nick._M_str);
  if (lVar2 != 0) {
    Jupiter::IRC::Client::Channel::getType();
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    uVar5 = 0;
    while( true ) {
      RenX::getCore();
      uVar3 = RenX::Core::getServerCount();
      if (uVar3 == uVar5) break;
      uVar3 = RenX::getCore();
      uVar4 = RenX::Core::getServer(uVar3);
      cVar1 = RenX::Server::isLogChanType((int)uVar4);
      if (cVar1 != '\0') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&local_60,0,local_60._M_string_length,"Rules: ",7);
        auVar6 = RenX::Server::getRules();
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_60,auVar6._8_8_,auVar6._0_8_);
        RenX::Server::sendMessage(uVar4,local_60._M_string_length,local_60._M_dataplus._M_p);
      }
      uVar5 = uVar5 + 1;
    }
    if (local_60._M_string_length == 0) {
      Jupiter::IRC::Client::sendMessage
                (source,local_40,local_38,0x40,
                 "Error: Channel not attached to any connected Renegade X servers.");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                               local_60.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void ShowRulesIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr)
	{
		int type = chan->getType();
		std::string msg;
		for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
		{
			RenX::Server *server = RenX::getCore()->getServer(i);
			if (server->isLogChanType(type))
			{
				msg = "Rules: ";
				msg += server->getRules();
				server->sendMessage(msg);
			}
		}
		if (msg.empty())
			source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
	}
}